

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * internal_exr_alloc(size_t bytes)

{
  size_t in_RDI;
  void *local_8;
  
  if (_glob_alloc_func == (exr_memory_allocation_func_t)0x0) {
    local_8 = malloc(in_RDI);
  }
  else {
    local_8 = (*_glob_alloc_func)(in_RDI);
  }
  return local_8;
}

Assistant:

void*
internal_exr_alloc (size_t bytes)
{
    if (_glob_alloc_func) return (*_glob_alloc_func) (bytes);
#ifdef _WIN32
    return HeapAlloc (GetProcessHeap (), 0, bytes);
#else
    return malloc (bytes);
#endif
}